

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::MicroString::ClearToDefault
          (MicroString *this,UnownedPayload *unowned_input,Arena *arena)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  string_view data;
  
  if (arena != (Arena *)0x0) {
    pcVar2 = (unowned_input->payload).payload;
    uVar1 = (unowned_input->payload).size;
    sVar3 = Capacity(this);
    if (uVar1 <= sVar3) {
      data._M_str = pcVar2;
      data._M_len = (ulong)uVar1;
      SetImpl(this,data,arena,7);
      return;
    }
  }
  SetUnowned(this,unowned_input,arena);
  return;
}

Assistant:

void MicroString::ClearToDefault(const UnownedPayload& unowned_input,
                                 Arena* arena) {
  auto input = unowned_input.get();
  if (arena != nullptr && Capacity() >= input.size()) {
    // If we are in an arena and the input fits in the existing capacity, use
    // that instead.
    Set(input, arena);
  } else {
    SetUnowned(unowned_input, arena);
  }
}